

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> __thiscall
bloaty::Bloaty::GetObjectFile(Bloaty *this,string *filename)

{
  InputFileFactory *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  InputFileFactory *pIVar5;
  undefined8 *in_RDX;
  Arg *in_R8;
  string_view format;
  _Head_base<0UL,_bloaty::InputFile_*,_false> local_70;
  string_view local_68 [3];
  string local_38;
  
  (**(code **)(*(long *)(filename->_M_dataplus)._M_p + 0x10))(&local_70);
  TryOpenELFFile((bloaty *)this,
                 (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)&local_70
                );
  if (this->file_factory_ == (InputFileFactory *)0x0) {
    TryOpenMachOFile((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                     local_68);
    pIVar5 = (InputFileFactory *)local_68[0]._M_len;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_68[0]._M_str;
    local_68[0] = (string_view)(auVar2 << 0x40);
    pIVar1 = this->file_factory_;
    this->file_factory_ = pIVar5;
    if (pIVar1 != (InputFileFactory *)0x0) {
      (*pIVar1->_vptr_InputFileFactory[1])();
      if ((long *)local_68[0]._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_68[0]._M_len + 8))();
      }
      pIVar5 = this->file_factory_;
    }
    if (pIVar5 == (InputFileFactory *)0x0) {
      TryOpenWebAssemblyFile
                ((bloaty *)local_68,
                 (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)&local_70
                );
      pIVar5 = (InputFileFactory *)local_68[0]._M_len;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_68[0]._M_str;
      local_68[0] = (string_view)(auVar3 << 0x40);
      pIVar1 = this->file_factory_;
      this->file_factory_ = pIVar5;
      if (pIVar1 != (InputFileFactory *)0x0) {
        (*pIVar1->_vptr_InputFileFactory[1])();
        if ((long *)local_68[0]._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_68[0]._M_len + 8))();
        }
        pIVar5 = this->file_factory_;
      }
      if (pIVar5 == (InputFileFactory *)0x0) {
        TryOpenPEFile((bloaty *)local_68,
                      (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                      &local_70);
        pIVar5 = (InputFileFactory *)local_68[0]._M_len;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_68[0]._M_str;
        local_68[0] = (string_view)(auVar4 << 0x40);
        pIVar1 = this->file_factory_;
        this->file_factory_ = pIVar5;
        if (pIVar1 != (InputFileFactory *)0x0) {
          (*pIVar1->_vptr_InputFileFactory[1])();
          if ((long *)local_68[0]._M_len != (long *)0x0) {
            (**(code **)(*(long *)local_68[0]._M_len + 8))();
          }
          pIVar5 = this->file_factory_;
        }
        if (pIVar5 == (InputFileFactory *)0x0) {
          local_68[0] = absl::NullSafeStringView((Nullable<const_char_*>)*in_RDX);
          format._M_str = (char *)local_68;
          format._M_len = (size_t)"unknown file type for file \'$0\'";
          absl::Substitute_abi_cxx11_(&local_38,(absl *)0x1f,format,in_R8);
          Throw(local_38._M_dataplus._M_p,0x623);
        }
      }
    }
  }
  if (local_70._M_head_impl != (InputFile *)0x0) {
    (*(local_70._M_head_impl)->_vptr_InputFile[2])();
  }
  return (__uniq_ptr_data<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>,_true,_true>)
         (__uniq_ptr_data<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ObjectFile> Bloaty::GetObjectFile(
    const std::string& filename) const {
  std::unique_ptr<InputFile> file(file_factory_.OpenFile(filename));
  auto object_file = TryOpenELFFile(file);

  if (!object_file.get()) {
    object_file = TryOpenMachOFile(file);
  }

  if (!object_file.get()) {
    object_file = TryOpenWebAssemblyFile(file);
  }

  if (!object_file.get()) {
    object_file = TryOpenPEFile(file);
  }

  if (!object_file.get()) {
    THROWF("unknown file type for file '$0'", filename.c_str());
  }

  return object_file;
}